

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::SMDImporter::ParseSignedInt(SMDImporter *this,char *szCurrent,char **szCurrentOut,int *out)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  
  do {
    bVar1 = *szCurrent;
    uVar5 = (ulong)bVar1;
    if (0x20 < uVar5) {
LAB_005eaa49:
      bVar2 = true;
LAB_005ea9e9:
      if (bVar2) {
        pbVar4 = (byte *)szCurrent + ((bVar1 - 0x2b & 0xfd) == 0);
        bVar7 = *pbVar4;
        iVar6 = 0;
        if (0xf5 < (byte)(bVar7 - 0x3a)) {
          iVar6 = 0;
          do {
            iVar6 = (uint)(byte)(bVar7 - 0x30) + iVar6 * 10;
            bVar7 = pbVar4[1];
            pbVar4 = pbVar4 + 1;
          } while (0xf5 < (byte)(bVar7 - 0x3a));
        }
        if (szCurrentOut != (char **)0x0) {
          *szCurrentOut = (char *)pbVar4;
        }
        iVar3 = -iVar6;
        if (bVar1 != 0x2d) {
          iVar3 = iVar6;
        }
        *out = iVar3;
      }
      return bVar2;
    }
    if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
        bVar2 = false;
        goto LAB_005ea9e9;
      }
      goto LAB_005eaa49;
    }
    szCurrent = (char *)((byte *)szCurrent + 1);
  } while( true );
}

Assistant:

bool SMDImporter::ParseSignedInt(const char* szCurrent, const char** szCurrentOut, int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtol10(szCurrent,szCurrentOut);
    return true;
}